

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *btmPt1;
  OutPt *btmPt2;
  
  btmPt1 = pp->Next;
  if (btmPt1 != pp) {
    btmPt2 = (OutPt *)0x0;
    do {
      lVar1 = (pp->Pt).Y;
      lVar2 = (btmPt1->Pt).Y;
      if (lVar1 < lVar2) {
LAB_0010e131:
        pp = btmPt1;
        btmPt2 = (OutPt *)0x0;
      }
      else if (lVar2 == lVar1) {
        lVar1 = (pp->Pt).X;
        lVar2 = (btmPt1->Pt).X;
        if (lVar2 <= lVar1) {
          if (lVar2 < lVar1) goto LAB_0010e131;
          if ((btmPt1->Next != pp) && (btmPt1->Prev != pp)) {
            btmPt2 = btmPt1;
          }
        }
      }
      btmPt1 = btmPt1->Next;
    } while (btmPt1 != pp);
    if (btmPt2 != (OutPt *)0x0) {
      while (btmPt2 != btmPt1) {
        bVar3 = FirstIsBottomPt(btmPt1,btmPt2);
        if (!bVar3) {
          pp = btmPt2;
        }
        do {
          do {
            btmPt2 = btmPt2->Next;
          } while ((btmPt2->Pt).X != (pp->Pt).X);
        } while ((btmPt2->Pt).Y != (pp->Pt).Y);
      }
    }
  }
  return pp;
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->Next;
  while (p != pp)
  {
    if (p->Pt.Y > pp->Pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->Pt.Y == pp->Pt.Y && p->Pt.X <= pp->Pt.X)
    {
      if (p->Pt.X < pp->Pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->Next != pp && p->Prev != pp) dups = p;
      }
    }
    p = p->Next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at BottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->Next;
      while (dups->Pt != pp->Pt) dups = dups->Next;
    }
  }
  return pp;
}